

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderCmp(Fts3SegReader *pLhs,Fts3SegReader *pRhs)

{
  int iVar1;
  int local_1c;
  int rc2;
  int rc;
  Fts3SegReader *pRhs_local;
  Fts3SegReader *pLhs_local;
  
  if ((pLhs->aNode == (char *)0x0) || (pRhs->aNode == (char *)0x0)) {
    local_1c = (uint)(pLhs->aNode == (char *)0x0) - (uint)(pRhs->aNode == (char *)0x0);
  }
  else {
    iVar1 = pLhs->nTerm - pRhs->nTerm;
    if (iVar1 < 0) {
      local_1c = memcmp(pLhs->zTerm,pRhs->zTerm,(long)pLhs->nTerm);
    }
    else {
      local_1c = memcmp(pLhs->zTerm,pRhs->zTerm,(long)pRhs->nTerm);
    }
    if (local_1c == 0) {
      local_1c = iVar1;
    }
  }
  if (local_1c == 0) {
    local_1c = pRhs->iIdx - pLhs->iIdx;
  }
  return local_1c;
}

Assistant:

static int fts3SegReaderCmp(Fts3SegReader *pLhs, Fts3SegReader *pRhs){
  int rc;
  if( pLhs->aNode && pRhs->aNode ){
    int rc2 = pLhs->nTerm - pRhs->nTerm;
    if( rc2<0 ){
      rc = memcmp(pLhs->zTerm, pRhs->zTerm, pLhs->nTerm);
    }else{
      rc = memcmp(pLhs->zTerm, pRhs->zTerm, pRhs->nTerm);
    }
    if( rc==0 ){
      rc = rc2;
    }
  }else{
    rc = (pLhs->aNode==0) - (pRhs->aNode==0);
  }
  if( rc==0 ){
    rc = pRhs->iIdx - pLhs->iIdx;
  }
  assert( rc!=0 );
  return rc;
}